

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * cJSON_SetValuestring(cJSON *object,char *valuestring)

{
  size_t sVar1;
  size_t sVar2;
  size_t v2_len;
  size_t v1_len;
  char *copy;
  char *valuestring_local;
  cJSON *object_local;
  
  if (((object == (cJSON *)0x0) || ((object->type & 0x10U) == 0)) || ((object->type & 0x100U) != 0))
  {
    object_local = (cJSON *)0x0;
  }
  else if ((object->valuestring == (char *)0x0) || (valuestring == (char *)0x0)) {
    object_local = (cJSON *)0x0;
  }
  else {
    sVar1 = strlen(valuestring);
    sVar2 = strlen(object->valuestring);
    if (sVar2 < sVar1) {
      object_local = (cJSON *)cJSON_strdup((uchar *)valuestring,&global_hooks);
      if (object_local == (cJSON *)0x0) {
        object_local = (cJSON *)0x0;
      }
      else {
        if (object->valuestring != (char *)0x0) {
          cJSON_free(object->valuestring);
        }
        object->valuestring = (char *)object_local;
      }
    }
    else if ((valuestring + sVar1 < object->valuestring) ||
            (object->valuestring + sVar2 < valuestring)) {
      strcpy(object->valuestring,valuestring);
      object_local = (cJSON *)object->valuestring;
    }
    else {
      object_local = (cJSON *)0x0;
    }
  }
  return (char *)object_local;
}

Assistant:

CJSON_PUBLIC(char*) cJSON_SetValuestring(cJSON *object, const char *valuestring)
{
    char *copy = NULL;
    size_t v1_len;
    size_t v2_len;
    /* if object's type is not cJSON_String or is cJSON_IsReference, it should not set valuestring */
    if ((object == NULL) || !(object->type & cJSON_String) || (object->type & cJSON_IsReference))
    {
        return NULL;
    }
    /* return NULL if the object is corrupted or valuestring is NULL */
    if (object->valuestring == NULL || valuestring == NULL)
    {
        return NULL;
    }

    v1_len = strlen(valuestring);
    v2_len = strlen(object->valuestring);

    if (v1_len <= v2_len)
    {
        /* strcpy does not handle overlapping string: [X1, X2] [Y1, Y2] => X2 < Y1 or Y2 < X1 */
        if (!( valuestring + v1_len < object->valuestring || object->valuestring + v2_len < valuestring ))
        {
            return NULL;
        }
        strcpy(object->valuestring, valuestring);
        return object->valuestring;
    }
    copy = (char*) cJSON_strdup((const unsigned char*)valuestring, &global_hooks);
    if (copy == NULL)
    {
        return NULL;
    }
    if (object->valuestring != NULL)
    {
        cJSON_free(object->valuestring);
    }
    object->valuestring = copy;

    return copy;
}